

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O2

Result<wasm::Function_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addFuncDecl
          (Result<wasm::Function_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames)

{
  int __val;
  Function *pFVar1;
  _Variant_storage<false,wasm::Function*,wasm::Err> *p_Var2;
  char *pcVar3;
  IString IVar4;
  string local_b0;
  string local_90;
  string_view local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Variant_storage<false,wasm::Function*,wasm::Err> *local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_38;
  __single_object f;
  
  local_40 = (_Variant_storage<false,wasm::Function*,wasm::Err> *)__return_storage_ptr__;
  std::make_unique<wasm::Function>();
  if (name.super_IString.str._M_str == (char *)0x0) {
    __val = this->funcCounter;
    this->funcCounter = __val + 1;
    std::__cxx11::to_string(&local_90,__val);
    pcVar3 = "fimport$";
    if (importNames == (ImportNames *)0x0) {
      pcVar3 = "";
    }
    std::operator+(&local_60,pcVar3,&local_90);
    IString::IString((IString *)&local_70,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_90);
    IVar4.str = (string_view)Names::getValidFunctionName(this->wasm,local_70);
    *(string_view *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = IVar4.str;
  }
  else {
    pFVar1 = Module::getFunctionOrNull(this->wasm,name);
    if (pFVar1 != (Function *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"repeated function name",(allocator<char> *)&local_90);
      Lexer::err((Err *)&local_60,&this->in,(ulong)pos,&local_b0);
      p_Var2 = local_40;
      std::__detail::__variant::_Variant_storage<false,wasm::Function*,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>(local_40,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_00bfd96c;
    }
    *(size_t *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = name.super_IString.str._M_len;
    *(char **)((long)local_38._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8) =
         name.super_IString.str._M_str;
    *(bool *)((long)local_38._M_t.
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x10) = true;
  }
  if (importNames != (ImportNames *)0x0) {
    pcVar3 = (importNames->mod).super_IString.str._M_str;
    (((Function *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->super_Importable).module.
    super_IString.str._M_len = (importNames->mod).super_IString.str._M_len;
    (((Function *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->super_Importable).module.
    super_IString.str._M_str = pcVar3;
    pcVar3 = (importNames->nm).super_IString.str._M_str;
    (((Function *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->super_Importable).base.
    super_IString.str._M_len = (importNames->nm).super_IString.str._M_len;
    (((Function *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->super_Importable).base.
    super_IString.str._M_str = pcVar3;
  }
  pFVar1 = Module::addFunction(this->wasm,&local_38);
  *(Function **)local_40 = pFVar1;
  local_40[0x20] = (_Variant_storage<false,wasm::Function*,wasm::Err>)0x0;
  p_Var2 = local_40;
LAB_00bfd96c:
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_38);
  return (Result<wasm::Function_*> *)p_Var2;
}

Assistant:

Result<Function*>
ParseDeclsCtx::addFuncDecl(Index pos, Name name, ImportNames* importNames) {
  auto f = std::make_unique<Function>();
  if (name.is()) {
    if (wasm.getFunctionOrNull(name)) {
      // TDOO: if the existing function is not explicitly named, fix its name
      // and continue.
      return in.err(pos, "repeated function name");
    }
    f->setExplicitName(name);
  } else {
    name = (importNames ? "fimport$" : "") + std::to_string(funcCounter++);
    name = Names::getValidFunctionName(wasm, name);
    f->name = name;
  }
  applyImportNames(*f, importNames);
  return wasm.addFunction(std::move(f));
}